

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O1

RK_S32 mpi_enc_opt_rc(void *ctx,char *next)

{
  int iVar1;
  
  if ((next != (char *)0x0) && (iVar1 = __isoc99_sscanf(next,"%d",(long)ctx + 0x48), iVar1 != 0)) {
    return 1;
  }
  _mpp_log_l(2,"mpi_enc_utils","invalid rate control usage -rc rc_mode\n",0);
  _mpp_log_l(2,"mpi_enc_utils","rc_mode 0:vbr 1:cbr 2:fixqp 3:avbr 4:smtrc\n",0);
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_rc(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;
    RK_S32 cnt = 0;

    if (next) {
        cnt = sscanf(next, "%d", &cmd->rc_mode);
        if (cnt)
            return 1;
    }

    mpp_err("invalid rate control usage -rc rc_mode\n");
    mpp_err("rc_mode 0:vbr 1:cbr 2:fixqp 3:avbr 4:smtrc\n");
    return 0;
}